

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawListSplitter::SetCurrentChannel(ImDrawListSplitter *this,ImDrawList *draw_list,int idx)

{
  ImDrawCmdHeader *pIVar1;
  ImDrawChannel *pIVar2;
  ImVector_ImDrawIdx *pIVar3;
  ImDrawCmd *pIVar4;
  ImWchar *pIVar5;
  undefined8 uVar6;
  int iVar7;
  wchar_t wVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  long lVar13;
  ImDrawCmd *pIVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if ((idx < 0) || (this->_Count <= idx)) {
    __assert_fail("idx >= 0 && idx < _Count",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0x701,"void ImDrawListSplitter::SetCurrentChannel(ImDrawList *, int)");
  }
  if (this->_Current == idx) {
    return;
  }
  iVar7 = (draw_list->CmdBuffer).Capacity;
  pIVar4 = (draw_list->CmdBuffer).Data;
  pIVar2 = (this->_Channels).Data + this->_Current;
  (pIVar2->_CmdBuffer).Size = (draw_list->CmdBuffer).Size;
  (pIVar2->_CmdBuffer).Capacity = iVar7;
  (pIVar2->_CmdBuffer).Data = pIVar4;
  wVar8 = (draw_list->IdxBuffer).Capacity;
  pIVar5 = (draw_list->IdxBuffer).Data;
  pIVar3 = &(this->_Channels).Data[this->_Current]._IdxBuffer;
  pIVar3->Size = (draw_list->IdxBuffer).Size;
  pIVar3->Capacity = wVar8;
  pIVar3->Data = pIVar5;
  this->_Current = idx;
  pIVar2 = (this->_Channels).Data + (uint)idx;
  wVar8 = (pIVar2->_CmdBuffer).Capacity;
  pIVar4 = (pIVar2->_CmdBuffer).Data;
  (draw_list->CmdBuffer).Size = (pIVar2->_CmdBuffer).Size;
  (draw_list->CmdBuffer).Capacity = wVar8;
  (draw_list->CmdBuffer).Data = pIVar4;
  pIVar3 = &(this->_Channels).Data[(uint)idx]._IdxBuffer;
  wVar8 = pIVar3->Capacity;
  pIVar5 = pIVar3->Data;
  (draw_list->IdxBuffer).Size = pIVar3->Size;
  (draw_list->IdxBuffer).Capacity = wVar8;
  (draw_list->IdxBuffer).Data = pIVar5;
  draw_list->_IdxWritePtr = (draw_list->IdxBuffer).Data + (draw_list->IdxBuffer).Size;
  lVar13 = (long)(draw_list->CmdBuffer).Size;
  if (lVar13 != 0) {
    pIVar4 = (draw_list->CmdBuffer).Data;
    pIVar14 = pIVar4 + lVar13 + -1;
    if (pIVar14 != (ImDrawCmd *)0x0) {
      pIVar1 = &draw_list->_CmdHeader;
      if (pIVar4[lVar13 + -1].ElemCount == 0) {
        fVar9 = (pIVar1->ClipRect).x;
        fVar10 = (pIVar1->ClipRect).y;
        fVar11 = (draw_list->_CmdHeader).ClipRect.z;
        fVar12 = (draw_list->_CmdHeader).ClipRect.w;
        uVar6 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
        *(undefined8 *)&pIVar4[lVar13 + -1].ClipRect.w =
             *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
        *(undefined8 *)((long)&pIVar4[lVar13 + -1].TextureId + 4) = uVar6;
        (pIVar14->ClipRect).x = fVar9;
        (pIVar14->ClipRect).y = fVar10;
        pIVar4[lVar13 + -1].ClipRect.z = fVar11;
        pIVar4[lVar13 + -1].ClipRect.w = fVar12;
        return;
      }
      auVar16[0] = -(*(char *)&(pIVar1->ClipRect).x == *(char *)&(pIVar14->ClipRect).x);
      auVar16[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 1) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.x + 1));
      auVar16[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 2) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.x + 2));
      auVar16[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 3) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.x + 3));
      auVar16[4] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.y ==
                    *(char *)&pIVar4[lVar13 + -1].ClipRect.y);
      auVar16[5] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 1) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.y + 1));
      auVar16[6] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 2) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.y + 2));
      auVar16[7] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 3) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.y + 3));
      auVar16[8] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.z ==
                    *(char *)&pIVar4[lVar13 + -1].ClipRect.z);
      auVar16[9] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 1) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.z + 1));
      auVar16[10] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 2) ==
                     *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.z + 2));
      auVar16[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 3) ==
                      *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.z + 3));
      auVar16[0xc] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                      *(char *)&pIVar4[lVar13 + -1].ClipRect.w);
      auVar16[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                      *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.w + 1));
      auVar16[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                      *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.w + 2));
      auVar16[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                      *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.w + 3));
      auVar15[0] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                    *(char *)&pIVar4[lVar13 + -1].ClipRect.w);
      auVar15[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.w + 1));
      auVar15[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.w + 2));
      auVar15[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].ClipRect.w + 3));
      auVar15[4] = -(*(char *)&(draw_list->_CmdHeader).TextureId ==
                    *(char *)&pIVar4[lVar13 + -1].TextureId);
      auVar15[5] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 1) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].TextureId + 1));
      auVar15[6] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 2) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].TextureId + 2));
      auVar15[7] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 3) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].TextureId + 3));
      auVar15[8] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 4) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].TextureId + 4));
      auVar15[9] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 5) ==
                    *(char *)((long)&pIVar4[lVar13 + -1].TextureId + 5));
      auVar15[10] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 6) ==
                     *(char *)((long)&pIVar4[lVar13 + -1].TextureId + 6));
      auVar15[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 7) ==
                      *(char *)((long)&pIVar4[lVar13 + -1].TextureId + 7));
      auVar15[0xc] = -((char)(draw_list->_CmdHeader).VtxOffset ==
                      (char)pIVar4[lVar13 + -1].VtxOffset);
      auVar15[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 1) ==
                      *(char *)((long)&pIVar4[lVar13 + -1].VtxOffset + 1));
      auVar15[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 2) ==
                      *(char *)((long)&pIVar4[lVar13 + -1].VtxOffset + 2));
      auVar15[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 3) ==
                      *(char *)((long)&pIVar4[lVar13 + -1].VtxOffset + 3));
      auVar15 = auVar15 & auVar16;
      if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff) {
        return;
      }
    }
  }
  ImDrawList::AddDrawCmd(draw_list);
  return;
}

Assistant:

void ImDrawListSplitter::SetCurrentChannel(ImDrawList* draw_list, int idx)
{
    IM_ASSERT(idx >= 0 && idx < _Count);
    if (_Current == idx)
        return;

    // Overwrite ImVector (12/16 bytes), four times. This is merely a silly optimization instead of doing .swap()
    memcpy(&_Channels.Data[_Current]._CmdBuffer, &draw_list->CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&_Channels.Data[_Current]._IdxBuffer, &draw_list->IdxBuffer, sizeof(draw_list->IdxBuffer));
    _Current = idx;
    memcpy(&draw_list->CmdBuffer, &_Channels.Data[idx]._CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&draw_list->IdxBuffer, &_Channels.Data[idx]._IdxBuffer, sizeof(draw_list->IdxBuffer));
    draw_list->_IdxWritePtr = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size;

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = (draw_list->CmdBuffer.Size == 0) ? NULL : &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd == NULL)
        draw_list->AddDrawCmd();
    else if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();
}